

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

int __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::stat
          (summary_impl<unsigned_int,_6UL> *this,char *__file,stat *__buf)

{
  unsigned_long uVar1;
  bool bVar2;
  ushort uVar3;
  int16_t ordered_index;
  uint uVar4;
  size_type __n;
  reference pdVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  unsigned_long *in_RCX;
  EVP_PKEY_CTX *ctx;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  summary_impl<unsigned_int,_6UL> *in_stack_00000030;
  uint tmp;
  double target_count;
  double e;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  float v;
  uint64_t count_now;
  data_t *ar [2];
  data_copy_t data_copy;
  vector<float,_std::allocator<float>_> *result;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined2 in_stack_fffffffffffffea4;
  undefined2 in_stack_fffffffffffffea6;
  undefined2 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeaa;
  float in_stack_fffffffffffffeac;
  uint16_t in_stack_fffffffffffffeb0;
  int16_t in_stack_fffffffffffffeb2;
  uint in_stack_fffffffffffffeb4;
  size_type in_stack_fffffffffffffeb8;
  data_copy_t *in_stack_fffffffffffffec0;
  vector<float,_std::allocator<float>_> *this_00;
  size_type in_stack_fffffffffffffec8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffed0;
  unsigned_long local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double *local_e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  undefined8 local_d0;
  float local_c4;
  undefined1 local_bd;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_ac;
  undefined8 local_a8;
  long local_a0;
  vector<float,_std::allocator<float>_> local_95;
  allocator<float> local_7d;
  undefined4 local_7c;
  __pointer_type local_78;
  __pointer_type local_70;
  undefined1 local_60 [64];
  unsigned_long *local_20;
  stat *local_18;
  char *local_10;
  summary_impl<unsigned_int,_6UL> *local_8;
  
  local_20 = in_RCX;
  local_18 = __buf;
  local_10 = __file;
  local_8 = this;
  refresh(in_stack_00000030);
  *local_20 = 0;
  local_18->st_dev = 0;
  data_copy_t::data_copy_t(in_stack_fffffffffffffec0);
  std::array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>::
  operator[]((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
              *)CONCAT26(in_stack_fffffffffffffea6,
                         CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_78 = std::atomic::operator_cast_to_data_t_
                       ((atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*> *)
                        0x25258b);
  std::array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>::
  operator[]((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
              *)CONCAT26(in_stack_fffffffffffffea6,
                         CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_70 = std::atomic::operator_cast_to_data_t_
                       ((atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*> *)
                        0x2525ae);
  if ((local_78 == (data_t *)0x0) && (local_70 == (__pointer_type)0x0)) {
    std::vector<double,_std::allocator<double>_>::size
              (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
    local_7c = 0;
    std::allocator<float>::allocator((allocator<float> *)0x252604);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,
               (value_type_conflict4 *)
               CONCAT44(in_stack_fffffffffffffeb4,
                        CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
               (allocator_type *)
               CONCAT44(in_stack_fffffffffffffeac,
                        CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
    std::allocator<float>::~allocator(&local_7d);
  }
  else {
    if (local_78 != (data_t *)0x0) {
      data_t::stat(local_78,(char *)local_20,(stat *)local_60);
    }
    if (local_70 != (data_t *)0x0) {
      data_t::stat(local_70,(char *)local_20,(stat *)(local_60 + 0x18));
    }
    if (*local_20 == 0) {
      __n = std::vector<double,_std::allocator<double>_>::size
                      (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
      local_95.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._1_4_ = 0;
      this_00 = &local_95;
      std::allocator<float>::allocator((allocator<float> *)0x252718);
      std::vector<float,_std::allocator<float>_>::vector
                (this_00,__n,
                 (value_type_conflict4 *)
                 CONCAT44(in_stack_fffffffffffffeb4,
                          CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
                 (allocator_type *)
                 CONCAT44(in_stack_fffffffffffffeac,
                          CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
      std::allocator<float>::~allocator((allocator<float> *)&local_95);
    }
    else {
      local_a0 = 0;
      local_a8 = 0x2000;
      local_ac = 0;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,_unsigned_int>,_std::allocator<std::pair<short,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeb4,
                             CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
                 (unsigned_long *)
                 CONCAT44(in_stack_fffffffffffffeac,
                          CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
                 (int *)CONCAT26(in_stack_fffffffffffffea6,
                                 CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)));
      local_b8 = 0x2000;
      local_bc = 0;
      ctx = (EVP_PKEY_CTX *)&local_b8;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,_unsigned_int>,_std::allocator<std::pair<short,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeb4,
                             CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
                 (unsigned_long *)
                 CONCAT44(in_stack_fffffffffffffeac,
                          CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
                 (int *)CONCAT26(in_stack_fffffffffffffea6,
                                 CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)));
      data_copy_t::init((data_copy_t *)local_60,ctx);
      local_bd = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x252812);
      std::vector<double,_std::allocator<double>_>::size
                (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
      std::vector<float,_std::allocator<float>_>::reserve
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_c4 = -1.8446744e+19;
      local_d0 = *(undefined8 *)(__file + 0x10);
      local_d8._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_e0 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      while (bVar2 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT26(in_stack_fffffffffffffea6,
                                            CONCAT24(in_stack_fffffffffffffea4,
                                                     in_stack_fffffffffffffea0)),
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        pdVar5 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_d8);
        local_e8 = *pdVar5;
        uVar4 = std::isnan(local_e8);
        if (((uVar4 & 1) != 0) || (local_e8 < 0.0)) {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffeb4,
                              CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
                     (value_type_conflict4 *)
                     CONCAT44(in_stack_fffffffffffffeac,
                              CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
        }
        else {
          if (1.0 < local_e8) {
            local_e8 = 1.0;
          }
          uVar1 = *local_20;
          auVar12._8_4_ = (int)(uVar1 >> 0x20);
          auVar12._0_8_ = uVar1;
          auVar12._12_4_ = 0x45300000;
          local_f8 = local_e8 *
                     ((auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
          uVar1 = *local_20;
          auVar9._8_4_ = (int)(uVar1 >> 0x20);
          auVar9._0_8_ = uVar1;
          auVar9._12_4_ = 0x45300000;
          local_100 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          pdVar6 = std::min<double>(&local_f8,&local_100);
          local_f0 = *pdVar6;
          if ((local_e8 == 0.0) && (!NAN(local_e8))) {
            local_108 = 1;
            puVar7 = std::min<unsigned_long>(&local_108,local_20);
            uVar1 = *puVar7;
            auVar10._8_4_ = (int)(uVar1 >> 0x20);
            auVar10._0_8_ = uVar1;
            auVar10._12_4_ = 0x45300000;
            local_f0 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          }
          while (auVar11._8_4_ = (int)((ulong)local_a0 >> 0x20), auVar11._0_8_ = local_a0,
                auVar11._12_4_ = 0x45300000,
                (auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_a0) - 4503599627370496.0) < local_f0) {
            uVar4 = data_copy_t::count((data_copy_t *)0x252a76);
            local_a0 = local_a0 + (ulong)uVar4;
            in_stack_fffffffffffffeb4 = uVar4;
            in_stack_fffffffffffffeb2 = data_copy_t::value((data_copy_t *)0x252aaa);
            in_stack_fffffffffffffeb0 = data_t::get_raw_index(in_stack_fffffffffffffeb2);
            in_stack_fffffffffffffeac = decode(0);
            local_18->st_dev =
                 (__dev_t)((double)local_18->st_dev +
                          (double)(in_stack_fffffffffffffeac * (float)uVar4));
            local_c4 = in_stack_fffffffffffffeac;
            data_copy_t::inc((data_copy_t *)
                             CONCAT44(in_stack_fffffffffffffeb4,
                                      CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))
                            );
          }
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffeb4,
                              CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)),
                     (value_type_conflict4 *)
                     CONCAT44(in_stack_fffffffffffffeac,
                              CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
        }
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_d8);
      }
      while (uVar3 = data_copy_t::value((data_copy_t *)0x252b4e), uVar3 < 0x2000) {
        ordered_index = data_copy_t::value((data_copy_t *)0x252b77);
        data_t::get_raw_index(ordered_index);
        fVar8 = decode(0);
        uVar4 = data_copy_t::count((data_copy_t *)0x252bb4);
        local_18->st_dev = (__dev_t)((double)local_18->st_dev + (double)(fVar8 * (float)uVar4));
        data_copy_t::inc((data_copy_t *)
                         CONCAT44(in_stack_fffffffffffffeb4,
                                  CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)));
      }
      local_bd = 1;
    }
  }
  local_95.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._5_4_ =
       1;
  data_copy_t::~data_copy_t
            ((data_copy_t *)
             CONCAT44(in_stack_fffffffffffffeb4,
                      CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)));
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }